

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall
nigel::IMC_Generator::generateUnaryLOperation
          (IMC_Generator *this,OperationType comb,HexOp op_acc,shared_ptr<nigel::IM_Operator> *op,
          shared_ptr<nigel::Token> *token,bool changeValue,u16 iterations)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_218;
  undefined1 local_210 [24];
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  shared_ptr<nigel::IM_Operator> local_1a8;
  shared_ptr<nigel::IM_Operator> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  shared_ptr<nigel::IM_Operator> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (comb != v) {
    if (comb == c) {
      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,&token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
      BuilderExecutable::generateNotification
                (&this->super_BuilderExecutable,imp_operationOnConstantCanBePrevented,
                 (shared_ptr<nigel::Token> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_a0,&local_1b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      uVar2 = (uint)iterations;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_acc,&local_1c8,&local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      return;
    }
    if (comb != t) {
      return;
    }
    uVar2 = (uint)iterations;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_acc,&local_1e8,&local_1f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    return;
  }
  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_210);
  iVar1 = *(int *)(local_210._0_8_ + 0x1c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
  if (iVar1 == 0) {
    local_210._16_8_ = op;
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_40,&local_b8);
    local_220 = &local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    local_218 = &local_50._M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    uVar2 = (uint)iterations;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_acc,&local_c8,&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (!changeValue) {
      return;
    }
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_);
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_adr_a,(shared_ptr<nigel::IM_Operator> *)&local_50,&local_e8);
  }
  else {
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_210);
    iVar1 = *(int *)(local_210._0_8_ + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
    if (iVar1 == 1) {
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_60,&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,movx_a_dptr,&local_108,&local_118);
      local_220 = &local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      local_218 = &local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      uVar2 = (uint)iterations;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_acc,&local_128,&local_138);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      if (!changeValue) {
        return;
      }
      local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,movx_dptr_a,&local_148,&local_158);
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_210);
      iVar1 = *(int *)(local_210._0_8_ + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_atr0,(shared_ptr<nigel::IM_Operator> *)&local_80,&local_168);
      local_220 = &local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      local_218 = &local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      uVar2 = (uint)iterations;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_acc,&local_178,&local_188);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      if (!changeValue) {
        return;
      }
      local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_atr0_a,&local_198,&local_1a8);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_220);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_218);
  return;
}

Assistant:

void IMC_Generator::generateUnaryLOperation( OperationType comb, HexOp op_acc, std::shared_ptr<IM_Operator> op, std::shared_ptr<Token> token, bool changeValue, u16 iterations )
	{
		if( comb == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
				for( int i = 0 ; i < iterations ; i++ )
					addCmd( op_acc );
				if( changeValue ) addCmd( HexOp::mov_adr_a, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
				for( int i = 0 ; i < iterations ; i++ )
					addCmd( op_acc );
				if( changeValue ) addCmd( HexOp::movx_dptr_a );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0, op );
				for( int i = 0 ; i < iterations ; i++ )
					addCmd( op_acc );
				if( changeValue ) addCmd( HexOp::mov_atr0_a );
			}
		}
		else if( comb == OT::c )
		{
			generateNotification( NT::imp_operationOnConstantCanBePrevented, token );
			addCmd( HexOp::mov_a_const, op );
			for( int i = 0 ; i < iterations ; i++ )
				addCmd( op_acc );
		}
		else if( comb == OT::t )
		{
			for( int i = 0 ; i < iterations ; i++ )
				addCmd( op_acc );
		}
	}